

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkForce.cpp
# Opt level: O2

void __thiscall chrono::ChLinkForce::ChLinkForce(ChLinkForce *this)

{
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  this->m_active = false;
  (this->m_R_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_F = 0.0;
  this->m_K = 0.0;
  this->m_R = 0.0;
  (this->m_F_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_F_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_K_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_K_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_R_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->m_F_modul,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->m_K_modul,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->m_R_modul,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

ChLinkForce::ChLinkForce() : m_active(false), m_F(0), m_K(0), m_R(0) {
    // Default: no modulation
    m_F_modul = chrono_types::make_shared<ChFunction_Const>(1);
    m_K_modul = chrono_types::make_shared<ChFunction_Const>(1);
    m_R_modul = chrono_types::make_shared<ChFunction_Const>(1);
}